

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O1

void Aig_ManPartSetNodePolarity(Aig_Man_t *p,Aig_Man_t *pPart,Vec_Int_t *vPio2Id)

{
  undefined1 *puVar1;
  void *pvVar2;
  void *pvVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  
  puVar1 = &pPart->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 8;
  pVVar5 = pPart->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      if (vPio2Id->nSize <= lVar4) goto LAB_006c233c;
      iVar6 = vPio2Id->pArray[lVar4];
      if (((long)iVar6 < 0) || (p->vObjs->nSize <= iVar6)) goto LAB_006c231d;
      *(ulong *)((long)pVVar5->pArray[lVar4] + 0x18) =
           *(ulong *)((long)pVVar5->pArray[lVar4] + 0x18) & 0xfffffffffffffff7 |
           (ulong)((uint)*(undefined8 *)((long)p->vObjs->pArray[iVar6] + 0x18) & 8);
      lVar4 = lVar4 + 1;
      pVVar5 = pPart->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pPart->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar4];
      if ((pvVar2 != (void *)0x0) && (0xfffffffd < ((uint)*(ulong *)((long)pvVar2 + 0x18) & 7) - 7))
      {
        *(ulong *)((long)pvVar2 + 0x18) =
             (*(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7) +
             (ulong)(((uint)*(ulong *)((long)pvVar2 + 0x10) ^
                     *(uint *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) >> 3)
                     & ((uint)*(ulong *)((long)pvVar2 + 8) ^
                       *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) >> 3) &
                    1) * 8;
      }
      lVar4 = lVar4 + 1;
      pVVar5 = pPart->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pPart->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      uVar7 = (ulong)(uint)pPart->nObjs[2] + lVar4;
      iVar6 = (int)uVar7;
      if ((iVar6 < 0) || (vPio2Id->nSize <= iVar6)) {
LAB_006c233c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = vPio2Id->pArray[uVar7 & 0xffffffff];
      if (((long)iVar6 < 0) || (p->vObjs->nSize <= iVar6)) {
LAB_006c231d:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar5->pArray[lVar4];
      pvVar3 = p->vObjs->pArray[iVar6];
      uVar8 = ((int)*(ulong *)((long)pvVar2 + 8) << 3 ^
              *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18)) & 8;
      *(ulong *)((long)pvVar2 + 0x18) =
           *(ulong *)((long)pvVar2 + 0x18) & 0xfffffffffffffff7 | (ulong)uVar8;
      if (uVar8 >> 3 != (uint)((*(uint *)((long)pvVar3 + 0x18) >> 3 & 1) != 0)) {
        __assert_fail("pObj->fPhase == pObjInit->fPhase",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPartSat.c"
                      ,0x14f,
                      "void Aig_ManPartSetNodePolarity(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)");
      }
      lVar4 = lVar4 + 1;
      pVVar5 = pPart->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Aig_ManPartSetNodePolarity( Aig_Man_t * p, Aig_Man_t * pPart, Vec_Int_t * vPio2Id )
{
    Aig_Obj_t * pObj, * pObjInit;
    int i;
    Aig_ManConst1(pPart)->fPhase = 1;
    Aig_ManForEachCi( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, i) );
        pObj->fPhase = pObjInit->fPhase;
    }
    Aig_ManForEachNode( pPart, pObj, i )
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj)) & (Aig_ObjFanin1(pObj)->fPhase ^ Aig_ObjFaninC1(pObj));
    Aig_ManForEachCo( pPart, pObj, i )
    {
        pObjInit = Aig_ManObj( p, Vec_IntEntry(vPio2Id, Aig_ManCiNum(pPart) + i) );
        pObj->fPhase = (Aig_ObjFanin0(pObj)->fPhase ^ Aig_ObjFaninC0(pObj));
        assert( pObj->fPhase == pObjInit->fPhase );
    }
}